

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.cpp
# Opt level: O1

void __thiscall
oout::ContainTest::ContainTest
          (ContainTest *this,shared_ptr<const_oout::Text> *text,shared_ptr<const_oout::Match> *match
          )

{
  undefined1 local_29;
  MatchTest *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ContainTest_00198f70;
  local_28 = (MatchTest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::MatchTest,std::allocator<oout::MatchTest>,std::shared_ptr<oout::Text_const>const&,std::shared_ptr<oout::Match_const>const&>
            (&local_20,&local_28,(allocator<oout::MatchTest> *)&local_29,text,match);
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_28->super_Test;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_20._M_pi;
  return;
}

Assistant:

ContainTest::ContainTest(
	const shared_ptr<const Text> &text,
	const shared_ptr<const Match> &match
) : test(make_shared<MatchTest>(text, match))
{
}